

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O0

opvar * opvar_clone(opvar *ov)

{
  int iVar1;
  opvar *poVar2;
  size_t sVar3;
  char *pcVar4;
  int len;
  opvar *tmpov;
  opvar *ov_local;
  
  if (ov == (opvar *)0x0) {
    return (opvar *)0x0;
  }
  poVar2 = (opvar *)malloc(0x10);
  if (poVar2 == (opvar *)0x0) {
    panic("could not alloc opvar struct");
  }
  iVar1 = (int)ov->spovartyp;
  if (iVar1 != 1) {
    if (iVar1 - 2U < 2) {
      sVar3 = strlen((ov->vardata).str);
      iVar1 = (int)sVar3;
      poVar2->spovartyp = ov->spovartyp;
      pcVar4 = (char *)malloc((long)(iVar1 + 1));
      (poVar2->vardata).str = pcVar4;
      memcpy((poVar2->vardata).str,(ov->vardata).str,(long)iVar1);
      (poVar2->vardata).str[iVar1] = '\0';
      return poVar2;
    }
    if (4 < iVar1 - 4U) {
      lc_error("Unknown opvar_clone value type (%i)!",(ulong)(uint)(int)ov->spovartyp);
      return poVar2;
    }
  }
  poVar2->spovartyp = ov->spovartyp;
  poVar2->vardata = ov->vardata;
  return poVar2;
}

Assistant:

struct opvar *opvar_clone(struct opvar *ov)
{
	if (ov) {
	    struct opvar *tmpov = malloc(sizeof(struct opvar));
	    if (!tmpov) panic("could not alloc opvar struct");

	    switch (ov->spovartyp) {
	    case SPOVAR_COORD:
	    case SPOVAR_REGION:
	    case SPOVAR_MAPCHAR:
	    case SPOVAR_MONST:
	    case SPOVAR_OBJ:
	    case SPOVAR_INT:
		{
		    tmpov->spovartyp = ov->spovartyp;
		    tmpov->vardata.l = ov->vardata.l;
		}
		break;
	    case SPOVAR_VARIABLE:
	    case SPOVAR_STRING:
		{
		    int len = strlen(ov->vardata.str);
		    tmpov->spovartyp = ov->spovartyp;
		    tmpov->vardata.str = malloc(len + 1);
		    memcpy(tmpov->vardata.str, ov->vardata.str, len);
		    tmpov->vardata.str[len] = '\0';
		}
		break;
	    default:
		{
		    lc_error("Unknown opvar_clone value type (%i)!", ov->spovartyp);
		}
	    }
	    return tmpov;
	}

	return NULL;
}